

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
__thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
::
get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
           *this,simplex_t idx,dimension_t dim,vertex_t n,
          reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *out)

{
  long lVar1;
  vertex_t vVar2;
  char k;
  undefined7 in_register_00000011;
  long *in_R9;
  simplex_t idx_00;
  
  idx_00 = CONCAT71(in_register_00000011,dim);
  vVar2 = (int)out + -1;
  k = (char)n + '\x01';
  while ('\x01' < k) {
    vVar2 = Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::get_max_vertex
                      ((Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_> *)
                       (idx + 0x30),idx_00,k,vVar2);
    lVar1 = *in_R9;
    *in_R9 = lVar1 + -4;
    *(vertex_t *)(lVar1 + -4) = vVar2;
    k = k + -1;
    idx_00 = idx_00 - ((long)vVar2 <<
                      ((char)((Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
                               *)(idx + 0x30))->bits_per_vertex * k & 0x3fU));
  }
  lVar1 = *in_R9;
  *(int *)(lVar1 + -4) = (int)idx_00;
  *(long *)this = lVar1;
  return (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          )(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this;
}

Assistant:

OutputIterator get_simplex_vertices(simplex_t idx, const dimension_t dim, vertex_t n,
        OutputIterator out) const {
      --n;
      for (dimension_t k = dim + 1; k > 1; --k) {
        n = simplex_encoding.get_max_vertex(idx, k, n);
        *out++ = n;
        idx -= simplex_encoding(n, k);
      }
      *out = static_cast<vertex_t>(idx);
      return out;
    }